

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskFileManager.cpp
# Opt level: O0

void __thiscall supermap::io::DiskFileManager::swap(DiskFileManager *this,path *first,path *second)

{
  undefined8 in_RDX;
  path *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string temp_name;
  char *in_stack_ffffffffffffff30;
  path *this_00;
  undefined1 local_b8 [16];
  path *in_stack_ffffffffffffff58;
  undefined1 local_90 [23];
  format in_stack_ffffffffffffff87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  path *in_stack_ffffffffffffff90;
  string local_58 [32];
  string local_38 [32];
  undefined8 local_18;
  path *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::filesystem::__cxx11::path::string(in_stack_ffffffffffffff58);
  std::operator+(in_RDI,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_58);
  this_00 = local_10;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff87);
  (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,this_00,local_90);
  std::filesystem::__cxx11::path::~path(this_00);
  (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,local_18,local_10);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff87);
  (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,local_b8,local_18);
  std::filesystem::__cxx11::path::~path(this_00);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DiskFileManager::swap(const std::filesystem::path &first, const std::filesystem::path &second) {
    const std::string temp_name = first.string() + "-swap";
    rename(first, temp_name);
    rename(second, first);
    rename(temp_name, second);
}